

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_foreach::run_impl(statement_foreach *this)

{
  bool bVar1;
  type_info *this_00;
  runtime_error *this_01;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_00000088;
  var *in_stack_00000090;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_00000098;
  context_t *in_stack_000000a0;
  var *obj;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_000000b8;
  var *in_stack_000000c0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_000000c8;
  context_t *in_stack_000000d0;
  string *in_stack_000000d8;
  context_t *in_stack_000000e0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_000000e8;
  var *in_stack_000000f0;
  string *in_stack_000000f8;
  context_t *in_stack_00000100;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_00000148;
  var *in_stack_00000150;
  string *in_stack_00000158;
  context_t *in_stack_00000160;
  undefined1 in_stack_0000088f;
  iterator *in_stack_00000890;
  runtime_type *in_stack_00000898;
  string *in_stack_ffffffffffffff48;
  any *in_stack_ffffffffffffff50;
  type_info *in_stack_ffffffffffffff58;
  allocator *paVar2;
  type_info *in_stack_ffffffffffffff60;
  allocator local_51;
  string local_50 [48];
  tree_node *local_20;
  undefined1 local_18 [8];
  undefined1 *local_10;
  
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2d9b35);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2d9b41);
  local_20 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff48);
  runtime_type::parse_expr(in_stack_00000898,in_stack_00000890,(bool)in_stack_0000088f);
  local_10 = local_18;
  cs_impl::any::type(in_stack_ffffffffffffff50);
  bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    foreach_helper<std::__cxx11::string,char>
              ((context_t *)this,obj,(var *)in_stack_000000a0,in_stack_00000098);
  }
  else {
    cs_impl::any::type(in_stack_ffffffffffffff50);
    bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      foreach_helper<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
                (in_stack_000000a0,(string *)in_stack_00000098,in_stack_00000090,in_stack_00000088);
    }
    else {
      cs_impl::any::type(in_stack_ffffffffffffff50);
      bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        foreach_helper<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,cs_impl::any>
                  (in_stack_000000d0,(string *)in_stack_000000c8,in_stack_000000c0,in_stack_000000b8
                  );
      }
      else {
        cs_impl::any::type(in_stack_ffffffffffffff50);
        bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        if (bVar1) {
          foreach_helper<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,cs_impl::any>
                    (in_stack_000000e0,in_stack_000000d8,(var *)in_stack_000000d0,in_stack_000000c8)
          ;
        }
        else {
          cs_impl::any::type(in_stack_ffffffffffffff50);
          bVar1 = std::type_info::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          if (bVar1) {
            foreach_helper<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>,std::pair<cs_impl::any,cs_impl::any>>
                      (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
          }
          else {
            this_00 = cs_impl::any::type(in_stack_ffffffffffffff50);
            bVar1 = std::type_info::operator==(this_00,in_stack_ffffffffffffff58);
            if (!bVar1) {
              this_01 = (runtime_error *)__cxa_allocate_exception(0x28);
              paVar2 = &local_51;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_50,"Unsupported type(foreach)",paVar2);
              runtime_error::runtime_error(this_01,in_stack_ffffffffffffff48);
              __cxa_throw(this_01,&runtime_error::typeinfo,runtime_error::~runtime_error);
            }
            foreach_helper<cs::range_type,cs::numeric>
                      (in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148);
          }
        }
      }
    }
  }
  cs_impl::any::~any((any *)0x2d9e7d);
  return;
}

Assistant:

void statement_foreach::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		const var &obj = context->instance->parse_expr(this->mObj.root());
		if (obj.type() == typeid(string))
			foreach_helper<string, char>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(list))
			foreach_helper<list, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(array))
			foreach_helper<array, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(hash_set))
			foreach_helper<hash_set, var>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(hash_map))
			foreach_helper<hash_map, pair>(context, this->mIt, obj, this->mBlock);
		else if (obj.type() == typeid(range_type))
			foreach_helper<range_type, numeric>(context, this->mIt, obj, this->mBlock);
		else
			throw runtime_error("Unsupported type(foreach)");
	}